

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImStrdupcpy(char *dst,size_t *p_dst_size,char *src)

{
  int *piVar1;
  size_t sVar2;
  char *pcVar3;
  ulong __n;
  size_t sVar4;
  
  if (p_dst_size == (size_t *)0x0) {
    sVar2 = strlen(dst);
    sVar4 = sVar2 + 1;
  }
  else {
    sVar4 = *p_dst_size;
  }
  sVar2 = strlen(src);
  __n = sVar2 + 1;
  if (sVar4 < __n) {
    if ((dst != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(dst,GImAllocatorUserData);
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    dst = (char *)(*GImAllocatorAllocFunc)(__n,GImAllocatorUserData);
    if (p_dst_size != (size_t *)0x0) {
      *p_dst_size = __n;
    }
  }
  pcVar3 = (char *)memcpy(dst,src,__n);
  return pcVar3;
}

Assistant:

char* ImStrdupcpy(char* dst, size_t* p_dst_size, const char* src)
{
    size_t dst_buf_size = p_dst_size ? *p_dst_size : strlen(dst) + 1;
    size_t src_size = strlen(src) + 1;
    if (dst_buf_size < src_size)
    {
        IM_FREE(dst);
        dst = (char*)IM_ALLOC(src_size);
        if (p_dst_size)
            *p_dst_size = src_size;
    }
    return (char*)memcpy(dst, (const void*)src, src_size);
}